

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O3

Vec_Int_t * Ssc_GiaGetOneSim(Gia_Man_t *p)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  word *__ptr;
  Vec_Int_t *pVVar4;
  int *__ptr_00;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  
  uVar6 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
  __ptr = Ssc_GiaGetCareMask(p);
  if ((int)uVar6 < 1) {
    if (__ptr == (word *)0x0) {
      return (Vec_Int_t *)0x0;
    }
  }
  else {
    iVar12 = 0;
    uVar8 = 0;
    do {
      uVar2 = __ptr[uVar8];
      if (uVar2 != 0) {
        bVar13 = (int)uVar2 == 0;
        uVar6 = uVar2 >> 0x20;
        if (!bVar13) {
          uVar6 = uVar2;
        }
        iVar7 = (uint)bVar13 * 0x20;
        iVar9 = iVar7 + 0x10;
        uVar8 = uVar6 >> 0x10;
        if ((short)uVar6 != 0) {
          iVar9 = iVar7;
          uVar8 = uVar6;
        }
        iVar7 = iVar9 + 8;
        uVar6 = uVar8 >> 8;
        if ((char)uVar8 != '\0') {
          iVar7 = iVar9;
          uVar6 = uVar8;
        }
        iVar9 = iVar7 + 4;
        uVar8 = uVar6 >> 4;
        if ((uVar6 & 0xf) != 0) {
          iVar9 = iVar7;
          uVar8 = uVar6;
        }
        uVar10 = (uint)(uVar8 >> 2) & 0x3fffffff;
        iVar7 = iVar9 + 2;
        if ((uVar8 & 3) != 0) {
          uVar10 = (uint)uVar8;
          iVar7 = iVar9;
        }
        iVar7 = (~uVar10 & 1) + iVar7;
        free(__ptr);
        if (iVar12 - iVar7 == 1) {
          return (Vec_Int_t *)0x0;
        }
        pVVar4 = (Vec_Int_t *)malloc(0x10);
        pVVar4->nCap = 100;
        pVVar4->nSize = 0;
        __ptr_00 = (int *)malloc(400);
        pVVar4->pArray = __ptr_00;
        pVVar5 = p->vCis;
        uVar6 = (ulong)(uint)pVVar5->nSize;
        if (pVVar5->nSize < 1) {
          return pVVar4;
        }
        uVar10 = iVar7 - iVar12;
        lVar11 = 0;
        goto LAB_00644f2e;
      }
      uVar8 = uVar8 + 1;
      iVar12 = iVar12 + -0x40;
    } while ((uVar6 & 0xffffffff) != uVar8);
  }
  free(__ptr);
  return (Vec_Int_t *)0x0;
LAB_00644f2e:
  iVar12 = pVVar5->pArray[lVar11];
  if ((iVar12 < 0) || (p->nObjs <= iVar12)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (p->pObjs == (Gia_Obj_t *)0x0) {
    return pVVar4;
  }
  uVar3 = (p->vSimsPi->nSize / ((int)uVar6 - p->nRegs)) * iVar12;
  if (((int)uVar3 < 0) || (p->vSims->nSize <= (int)uVar3)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  uVar3 = *(uint *)((long)p->vSims->pArray + (long)((int)uVar10 >> 5) * 4 + (ulong)uVar3 * 8);
  uVar1 = pVVar4->nSize;
  if (uVar1 == pVVar4->nCap) {
    if ((int)uVar1 < 0x10) {
      if (__ptr_00 == (int *)0x0) {
        __ptr_00 = (int *)malloc(0x40);
      }
      else {
        __ptr_00 = (int *)realloc(__ptr_00,0x40);
      }
      pVVar4->pArray = __ptr_00;
      iVar12 = 0x10;
      if (__ptr_00 == (int *)0x0) {
LAB_0064508e:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
    }
    else {
      if (__ptr_00 == (int *)0x0) {
        __ptr_00 = (int *)malloc((ulong)uVar1 * 8);
      }
      else {
        __ptr_00 = (int *)realloc(__ptr_00,(ulong)uVar1 * 8);
      }
      pVVar4->pArray = __ptr_00;
      if (__ptr_00 == (int *)0x0) goto LAB_0064508e;
      iVar12 = uVar1 * 2;
    }
    pVVar4->nCap = iVar12;
  }
  pVVar4->nSize = uVar1 + 1;
  __ptr_00[(int)uVar1] = (uint)((uVar3 >> (uVar10 & 0x1f) & 1) != 0);
  lVar11 = lVar11 + 1;
  pVVar5 = p->vCis;
  uVar6 = (ulong)pVVar5->nSize;
  if ((long)uVar6 <= lVar11) {
    return pVVar4;
  }
  goto LAB_00644f2e;
}

Assistant:

Vec_Int_t * Ssc_GiaGetOneSim( Gia_Man_t * p )
{
    Vec_Int_t * vInit;
    Gia_Obj_t * pObj;
    int i, iBit, nWords = Gia_ObjSimWords( p );
    word * pRes = Ssc_GiaGetCareMask( p );
    iBit = Ssc_SimFindBit( pRes, nWords );
    ABC_FREE( pRes );
    if ( iBit == -1 )
        return NULL;
    vInit = Vec_IntAlloc( 100 );
    Gia_ManForEachCi( p, pObj, i )
        Vec_IntPush( vInit, Abc_InfoHasBit((unsigned *)Gia_ObjSimObj(p, pObj), iBit) );
    return vInit;
}